

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshFaceListBlock(Parser *this,uint iNumFaces,Mesh *mesh)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_> *this_00;
  byte *pbVar4;
  byte *pbVar5;
  int local_c4;
  Face local_b8;
  
  this_00 = &(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces;
  std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::resize
            (this_00,(ulong)iNumFaces);
  pbVar5 = (byte *)this->filePtr;
  local_c4 = 0;
  do {
    bVar1 = *pbVar5;
    pbVar4 = pbVar5;
    if (bVar1 == 0x2a) {
      while( true ) {
        pbVar5 = pbVar4 + 1;
        this->filePtr = (char *)pbVar5;
        iVar3 = strncmp("MESH_FACE",(char *)pbVar5,9);
        if (iVar3 != 0) break;
        bVar1 = pbVar4[10];
        if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        pbVar5 = pbVar4 + 0xb;
        if (bVar1 == 0) {
          pbVar5 = pbVar4 + 10;
        }
        this->filePtr = (char *)pbVar5;
        local_b8.super_FaceWithSmoothingGroup.mIndices[0] = 0xffffffff;
        local_b8.super_FaceWithSmoothingGroup.mIndices[1] = 0xffffffff;
        local_b8.super_FaceWithSmoothingGroup.mIndices[2] = 0xffffffff;
        local_b8.super_FaceWithSmoothingGroup.iSmoothGroup = 0;
        local_b8.iMaterial = 0xffffffff;
        local_b8.iFace = 0;
        ParseLV4MeshFace(this,&local_b8);
        if (local_b8.iFace < iNumFaces) {
          memcpy((this_00->super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_b8.iFace,&local_b8,0x84);
        }
        else {
          LogWarning(this,"Face has an invalid index. It will be ignored");
        }
        pbVar5 = (byte *)this->filePtr;
        pbVar4 = pbVar5;
        if (*pbVar5 != 0x2a) break;
      }
      bVar1 = *pbVar5;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_00403b23;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_FACE_LIST chunk (Level 3)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_c4 = local_c4 + -1;
        if (local_c4 == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_00403b25;
        local_c4 = local_c4 + 1;
      }
LAB_00403b23:
      bVar2 = false;
    }
LAB_00403b25:
    this->bLastWasEndLine = bVar2;
    pbVar5 = pbVar5 + 1;
    this->filePtr = (char *)pbVar5;
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshFaceListBlock(unsigned int iNumFaces, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the face array
    mesh.mFaces.resize(iNumFaces);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_FACE" ,9))
            {

                ASE::Face mFace;
                ParseLV4MeshFace(mFace);

                if (mFace.iFace >= iNumFaces)
                {
                    LogWarning("Face has an invalid index. It will be ignored");
                }
                else mesh.mFaces[mFace.iFace] = mFace;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_FACE_LIST");
    }
    return;
}